

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O2

void __thiscall
duckdb::DBConfig::SetOption
          (DBConfig *this,DatabaseInstance *db,ConfigurationOption *option,Value *value)

{
  InvalidInputException *this_00;
  allocator local_a1;
  LogicalType local_a0;
  string local_88;
  Value input;
  
  ::std::mutex::lock(&this->config_lock);
  if (option->set_global != (set_global_function_t)0x0) {
    ::std::__cxx11::string::string((string *)&local_88,option->parameter_type,&local_a1);
    ParseLogicalType(&local_a0,&local_88);
    Value::DefaultCastAs(&input,value,&local_a0,false);
    LogicalType::~LogicalType(&local_a0);
    ::std::__cxx11::string::~string((string *)&local_88);
    (*option->set_global)(db,this,&input);
    Value::~Value(&input);
    pthread_mutex_unlock((pthread_mutex_t *)this);
    return;
  }
  this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&input,"Could not set option \"%s\" as a global option",
             (allocator *)&local_88);
  InvalidInputException::InvalidInputException<char_const*>(this_00,(string *)&input,option->name);
  __cxa_throw(this_00,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void DBConfig::SetOption(DatabaseInstance *db, const ConfigurationOption &option, const Value &value) {
	lock_guard<mutex> l(config_lock);
	if (!option.set_global) {
		throw InvalidInputException("Could not set option \"%s\" as a global option", option.name);
	}
	D_ASSERT(option.reset_global);
	Value input = value.DefaultCastAs(ParseLogicalType(option.parameter_type));
	option.set_global(db, *this, input);
}